

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O2

void adt_hnode_insert(adt_hnode_t *node,adt_hkey_t *key,uint32_t u32Hash)

{
  anon_union_8_2_ea40ae9c_for_child *paVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  adt_hmatch_t *__ptr;
  undefined8 uVar5;
  adt_hmatch_t *paVar6;
  long lVar7;
  byte bVar8;
  long lVar9;
  adt_hkey_t **ppaVar10;
  byte bVar11;
  ulong uVar12;
  
  do {
    if (node == (adt_hnode_t *)0x0) {
      __assert_fail("node",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                    ,0x14b,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
    }
    if (key == (adt_hkey_t *)0x0) {
      __assert_fail("key",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                    ,0x14c,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
    }
    bVar11 = node->u8Width;
    if (bVar11 == 0x10) {
      bVar11 = node->u8Depth << 2;
    }
    else {
      bVar4 = node->u8Cur;
      paVar1 = &node->child;
      lVar9 = 0;
      while (lVar7 = lVar9, (ulong)bVar4 * 0x10 + 0x10 != lVar7 + 0x10) {
        lVar9 = lVar7 + 0x10;
        if (*(uint32_t *)((long)&paVar1->match->u32Hash + lVar7) == u32Hash) {
          lVar9 = *(long *)((long)&paVar1->match->key + lVar7);
          if (lVar9 != 0) {
            do {
              lVar7 = lVar9;
              lVar9 = *(long *)(lVar7 + 0x10);
            } while (lVar9 != 0);
            *(adt_hkey_t **)(lVar7 + 0x10) = key;
            return;
          }
          __assert_fail("hkey != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                        ,0x156,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
        }
      }
      __ptr = paVar1->match;
      if (bVar4 < bVar11) {
        __ptr[bVar4].key = key;
        node->u8Cur = bVar4 + 1;
        (node->child).match[bVar4].u32Hash = u32Hash;
        return;
      }
      bVar8 = bVar11 * '\x02';
      node->u8Width = bVar8;
      if (bVar8 < 0x10) {
        paVar6 = (adt_hmatch_t *)malloc((ulong)(byte)(bVar11 << 5));
        paVar1->match = paVar6;
        if (paVar6 != (adt_hmatch_t *)0x0) {
          lVar9 = 0;
          for (uVar12 = 0; uVar12 < bVar4; uVar12 = uVar12 + 1) {
            puVar2 = (undefined8 *)((long)&__ptr->u32Hash + lVar9);
            uVar5 = puVar2[1];
            puVar3 = (undefined8 *)((long)&((node->child).match)->u32Hash + lVar9);
            *puVar3 = *puVar2;
            puVar3[1] = uVar5;
            bVar4 = node->u8Cur;
            lVar9 = lVar9 + 0x10;
          }
          free(__ptr);
          bVar11 = node->u8Cur;
          (node->child).match[bVar11].key = key;
          node->u8Cur = bVar11 + 1;
          (node->child).match[bVar11].u32Hash = u32Hash;
          return;
        }
        __assert_fail("node->child.match",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                      ,0x167,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
      }
      if (bVar8 != 0x10) {
        __assert_fail("node->u8Width==16",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                      ,0x172,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
      }
      paVar6 = (adt_hmatch_t *)malloc(0x100);
      paVar1->match = paVar6;
      if (paVar6 == (adt_hmatch_t *)0x0) {
        __assert_fail("node->child.node",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                      ,0x174,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
      }
      for (lVar9 = 0; lVar9 != 0x100; lVar9 = lVar9 + 0x10) {
        adt_hnode_create((adt_hnode_t *)((long)&((node->child).match)->u32Hash + lVar9));
        *(uint8_t *)((long)&((node->child).match)->u32Hash + lVar9 + 2) = node->u8Depth + '\x01';
      }
      if (8 < node->u8Depth) {
        __assert_fail("node->u8Depth<=8",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                      ,0x179,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
      }
      bVar11 = node->u8Depth << 2;
      ppaVar10 = &__ptr->key;
      for (uVar12 = 0; uVar12 < node->u8Cur; uVar12 = uVar12 + 1) {
        adt_hnode_insert((adt_hnode_t *)
                         ((long)&paVar1->match->u32Hash +
                         (ulong)((((adt_hmatch_t *)(ppaVar10 + -1))->u32Hash >> (bVar11 & 0x1f) &
                                 0xf) << 4)),*ppaVar10,((adt_hmatch_t *)(ppaVar10 + -1))->u32Hash);
        ppaVar10 = ppaVar10 + 2;
      }
      free(__ptr);
    }
    node = (adt_hnode_t *)
           ((long)&((node->child).match)->u32Hash + (ulong)((u32Hash >> (bVar11 & 0x1f) & 0xf) << 4)
           );
  } while( true );
}

Assistant:

void adt_hnode_insert(adt_hnode_t *node, adt_hkey_t *key, uint32_t u32Hash){
	uint8_t i;
	assert(node);
	assert(key);
	if(node->u8Width == 16){
		uint32_t u32Bits = (node->u8Depth)*4;
		uint8_t u8Bucket = (uint8_t) ((u32Hash >> u32Bits) & 0xF);
		adt_hnode_insert(&node->child.node[u8Bucket],key,u32Hash);
	}
	else{
		for(i=0;i<node->u8Cur;i++){
			if(node->child.match[i].u32Hash == u32Hash){
				adt_hkey_t *hkey = node->child.match[i].key;
				assert(hkey != 0);
				while(hkey->next){
					hkey = hkey->next;
				}
				hkey->next = key;
				return;
			}
		}
		if(node->u8Cur < node->u8Width){
			node->child.match[node->u8Cur].key = key;
			node->child.match[node->u8Cur++].u32Hash = u32Hash;
		}
		else{
			adt_hmatch_t* old = node->child.match;
			node->u8Width *= 2;
			if(node->u8Width<16){
				node->child.match = (adt_hmatch_t*) malloc(sizeof(adt_hmatch_t)*node->u8Width);
				assert(node->child.match);
				for(i=0;i<node->u8Cur;i++){
					node->child.match[i]=old[i];
				}
				free(old);
				node->child.match[node->u8Cur].key = key;
				node->child.match[node->u8Cur++].u32Hash = u32Hash;
			}
			else{
            uint32_t u32Bits;
            uint8_t u8Bucket;
				assert(node->u8Width==16);
				node->child.node = (adt_hnode_t*) malloc(sizeof(adt_hnode_t)*16);
				assert(node->child.node);
				for(i=0;i<16;i++){
					adt_hnode_create(&node->child.node[i]);
					node->child.node[i].u8Depth = node->u8Depth+1;
				}
				assert(node->u8Depth<=8);
            u32Bits = (node->u8Depth)*4;
				for(i=0;i<node->u8Cur;i++){
					u8Bucket = (uint8_t) ( (old[i].u32Hash >> u32Bits) & 0xF);
					adt_hnode_insert(&node->child.node[u8Bucket],old[i].key,old[i].u32Hash);
				}
				free(old);
            u8Bucket = (uint8_t) ((u32Hash >> u32Bits) & 0xF);
				adt_hnode_insert(&node->child.node[u8Bucket],key,u32Hash);
			}
		}
	}
}